

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_reset(tsd_t *tsd,arena_t *arena)

{
  pthread_mutex_t *ppVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  undefined8 uVar8;
  edata_t *peVar9;
  ulong uVar10;
  rtree_ctx_t *rtree_ctx;
  long lVar11;
  bin_with_batch_t *batched_bin;
  bin_t *bin;
  ulong uVar12;
  rtree_ctx_t local_1b0;
  
  malloc_mutex_lock((tsdn_t *)tsd,&arena->large_mtx);
  ppVar1 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
  do {
    peVar9 = (arena->large).head.qlh_first;
    if (peVar9 == (edata_t *)0x0) {
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar1);
      for (uVar12 = 0; uVar12 != 0x24; uVar12 = uVar12 + 1) {
        for (uVar10 = 0; uVar10 < duckdb_je_bin_infos[uVar12].n_shards; uVar10 = uVar10 + 1) {
          lVar11 = uVar10 << 8;
          if (uVar12 < duckdb_je_bin_info_nbatched_sizes) {
            lVar11 = uVar10 * 0x288;
          }
          bin = (bin_t *)((long)&arena->nthreads[0].repr +
                         lVar11 + (ulong)duckdb_je_arena_bin_offsets[uVar12]);
          malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)bin);
          if (uVar12 < duckdb_je_bin_info_nbatched_sizes) {
            batcher_init((batcher_t *)(bin + 1),0x10);
          }
          peVar9 = bin->slabcur;
          if (peVar9 != (edata_t *)0x0) {
            bin->slabcur = (edata_t *)0x0;
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x48));
            duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
            malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)bin);
          }
          ppVar1 = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x48);
          while (peVar9 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull),
                peVar9 != (edata_t *)0x0) {
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
            malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)bin);
          }
          while (peVar9 = (bin->slabs_full).head.qlh_first, peVar9 != (edata_t *)0x0) {
            arena_bin_slabs_full_remove(arena,bin,peVar9);
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
            malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)bin);
          }
          (bin->stats).curregs = 0;
          (bin->stats).curslabs = 0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar1);
        }
      }
      duckdb_je_pa_shard_reset((tsdn_t *)tsd,&arena->pa_shard);
      return;
    }
    pvVar5 = peVar9->e_addr;
    (arena->large_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(ppVar1);
    rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    if (tsd == (tsd_t *)0x0) {
      duckdb_je_rtree_ctx_data_init(&local_1b0);
      rtree_ctx = &local_1b0;
    }
    uVar10 = (ulong)pvVar5 & 0xffffffffc0000000;
    uVar12 = (ulong)(((uint)((ulong)pvVar5 >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar12);
    uVar12 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar12);
    if (uVar12 != uVar10) {
      if (rtree_ctx->l2_cache[0].leafkey == uVar10) {
        prVar6 = rtree_ctx->l2_cache[0].leaf;
        rtree_ctx->l2_cache[0].leafkey = uVar12;
        rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
        *puVar2 = uVar10;
        puVar2[1] = (ulong)prVar6;
      }
      else {
        for (lVar11 = 0x118; lVar11 != 0x188; lVar11 = lVar11 + 0x10) {
          if (*(ulong *)((long)rtree_ctx->cache + lVar11 + -8) == uVar10) {
            uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar11);
            puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar11 + -0x18);
            uVar8 = puVar3[1];
            puVar4 = (undefined8 *)((long)rtree_ctx->cache + lVar11 + -8);
            *puVar4 = *puVar3;
            puVar4[1] = uVar8;
            *(ulong *)((long)rtree_ctx->cache + lVar11 + -0x18) = uVar12;
            *(ulong *)((long)(rtree_ctx->cache + -1) + lVar11) = puVar2[1];
            *puVar2 = uVar10;
            puVar2[1] = uVar7;
            goto LAB_00e53dbf;
          }
        }
        duckdb_je_rtree_leaf_elm_lookup_hard
                  ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                   (ulong)pvVar5 & 0xfffffffffffff000,true,false);
      }
    }
LAB_00e53dbf:
    duckdb_je_large_dalloc((tsdn_t *)tsd,peVar9);
    malloc_mutex_lock((tsdn_t *)tsd,&arena->large_mtx);
  } while( true );
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (edata_t *edata = edata_list_active_first(&arena->large);
	    edata != NULL; edata = edata_list_active_first(&arena->large)) {
		void *ptr = edata_base_get(edata);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		emap_alloc_ctx_t alloc_ctx;
		emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		    &alloc_ctx);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		if (config_prof && opt_prof && alloc_ctx.szind < SC_NBINS) {
			arena_dalloc_promoted_impl(tsd_tsdn(tsd), ptr,
			    /* tcache */ NULL, /* slow_path */ true, edata);
		} else {
			large_dalloc(tsd_tsdn(tsd), edata);
		}
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena, arena_get_bin(arena, i, j),
			    i);
		}
	}
	pa_shard_reset(tsd_tsdn(tsd), &arena->pa_shard);
}